

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O0

array<unsigned_short,_5UL> __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<int>>::readPattern<std::array<unsigned_short,5ul>>
          (BitMatrixCursor<ZXing::PointT<int>_> *this,int range)

{
  undefined1 uVar1;
  undefined1 uVar3;
  int iVar4;
  iterator pvVar5;
  int in_ESI;
  array<unsigned_short,_5UL> aVar6;
  BitMatrixCursor<ZXing::PointT<int>_> *unaff_retaddr;
  value_type_conflict2 *i;
  iterator __end0;
  iterator __begin0;
  array<unsigned_short,_5UL> *__range3;
  array<unsigned_short,_5UL> res;
  ushort *local_30;
  int local_1c;
  undefined1 local_a;
  undefined1 in_stack_fffffffffffffff7;
  int in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffc;
  unsigned_short in_stack_fffffffffffffffe;
  undefined2 uVar2;
  undefined8 uVar7;
  
  memset(&local_a,0,10);
  local_30 = std::array<unsigned_short,_5UL>::begin((array<unsigned_short,_5UL> *)0x2fb28b);
  pvVar5 = std::array<unsigned_short,_5UL>::end((array<unsigned_short,_5UL> *)0x2fb29a);
  local_1c = in_ESI;
  for (; local_30 != pvVar5; local_30 = local_30 + 1) {
    iVar4 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                      (unaff_retaddr,CONCAT22(in_stack_fffffffffffffffe,in_stack_fffffffffffffffc),
                       in_stack_fffffffffffffff8,(bool)in_stack_fffffffffffffff7);
    *local_30 = (ushort)iVar4;
    if (*local_30 == 0) break;
    if (local_1c != 0) {
      local_1c = local_1c - (uint)*local_30;
    }
  }
  uVar3 = in_stack_fffffffffffffff7;
  uVar1 = local_a;
  uVar2 = CONCAT11(uVar3,uVar1);
  aVar6._M_elems[0] = uVar2;
  uVar7._2_2_ = (unsigned_short)in_stack_fffffffffffffff8;
  uVar7._4_2_ = (unsigned_short)((uint)in_stack_fffffffffffffff8 >> 0x10);
  uVar7._6_2_ = in_stack_fffffffffffffffc;
  aVar6._M_elems[4] = in_stack_fffffffffffffffe;
  return (array<unsigned_short,_5UL>)aVar6._M_elems;
}

Assistant:

ARRAY readPattern(int range = 0)
	{
		ARRAY res = {};
		for (auto& i : res) {
			i = stepToEdge(1, range);
			if (!i)
				return res;
			if (range)
				range -= i;
		}
		return res;
	}